

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

jsgf_t * jsgf_parse_file(char *filename,jsgf_t *parent)

{
  int iVar1;
  yyscan_t in_RAX;
  FILE *__stream;
  jsgf_t *jsgf;
  char *pcVar2;
  yyscan_t yyscanner;
  yyscan_t local_28;
  
  local_28 = in_RAX;
  yylex_init(&local_28);
  if (filename == (char *)0x0) {
    yyset_in(_stdin,local_28);
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                     ,0x352,"Failed to open %s for parsing",filename);
      return (jsgf_t *)0x0;
    }
    yyset_in((FILE *)__stream,local_28);
  }
  jsgf = jsgf_grammar_new(parent);
  if (parent == (jsgf_t *)0x0) {
    jsgf_set_search_path(jsgf,filename);
  }
  iVar1 = yyparse(local_28,jsgf);
  if (iVar1 == 0) {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    yylex_destroy(local_28);
  }
  else {
    pcVar2 = "(stdin)";
    if (filename != (char *)0x0) {
      pcVar2 = filename;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
            ,0x360,"Failed to parse JSGF grammar from \'%s\'\n",pcVar2);
    jsgf_grammar_free(jsgf);
    yylex_destroy(local_28);
    jsgf = (jsgf_t *)0x0;
  }
  return jsgf;
}

Assistant:

jsgf_t *
jsgf_parse_file(const char *filename, jsgf_t * parent)
{
    yyscan_t yyscanner;
    jsgf_t *jsgf;
    int yyrv;
    FILE *in = NULL;

    yylex_init(&yyscanner);
    if (filename == NULL) {
        yyset_in(stdin, yyscanner);
    }
    else {
        in = fopen(filename, "r");
        if (in == NULL) {
            E_ERROR_SYSTEM("Failed to open %s for parsing", filename);
            return NULL;
        }
        yyset_in(in, yyscanner);
    }

    jsgf = jsgf_grammar_new(parent);

    if (!parent)
        jsgf_set_search_path(jsgf, filename);

    yyrv = yyparse(yyscanner, jsgf);
    if (yyrv != 0) {
        E_ERROR("Failed to parse JSGF grammar from '%s'\n",
                filename ? filename : "(stdin)");
        jsgf_grammar_free(jsgf);
        yylex_destroy(yyscanner);
        return NULL;
    }
    if (in)
        fclose(in);
    yylex_destroy(yyscanner);

    return jsgf;
}